

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_set_format_ar(archive_write *a)

{
  void *pvVar1;
  ar_w *ar;
  archive_write *a_local;
  
  if (a->format_free != (_func_int_archive_write_ptr *)0x0) {
    (*a->format_free)(a);
  }
  pvVar1 = calloc(1,0x28);
  if (pvVar1 == (void *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate ar data");
    a_local._4_4_ = -0x1e;
  }
  else {
    a->format_data = pvVar1;
    a->format_name = "ar";
    a->format_write_header = archive_write_ar_header;
    a->format_write_data = archive_write_ar_data;
    a->format_close = archive_write_ar_close;
    a->format_free = archive_write_ar_free;
    a->format_finish_entry = archive_write_ar_finish_entry;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_set_format_ar(struct archive_write *a)
{
	struct ar_w *ar;

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	ar = calloc(1, sizeof(*ar));
	if (ar == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate ar data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = ar;

	a->format_name = "ar";
	a->format_write_header = archive_write_ar_header;
	a->format_write_data = archive_write_ar_data;
	a->format_close = archive_write_ar_close;
	a->format_free = archive_write_ar_free;
	a->format_finish_entry = archive_write_ar_finish_entry;
	return (ARCHIVE_OK);
}